

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O2

rt_expression_interface<double> * __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::recursive_manipulation
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_manipulation_wrapper<viennamath::rt_expression_interface<double>_> *fw)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  rt_expression_interface<double> *prVar5;
  rt_expression_interface<double> *prVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  cVar1 = (**(code **)(*(long *)*fw + 0x18))(*fw,this);
  if (cVar1 != '\0') {
    prVar5 = (rt_expression_interface<double> *)(**(code **)(*(long *)*fw + 0x10))(*fw,this);
    return prVar5;
  }
  prVar6 = (rt_expression_interface<double> *)operator_new(0x20);
  prVar5 = (this->lhs_)._M_ptr;
  iVar2 = (*prVar5->_vptr_rt_expression_interface[0xc])(prVar5,fw);
  iVar3 = (*((this->op_)._M_ptr)->_vptr_op_interface[2])();
  prVar5 = (this->rhs_)._M_ptr;
  iVar4 = (*prVar5->_vptr_rt_expression_interface[0xc])(prVar5,fw);
  prVar6->_vptr_rt_expression_interface = (_func_int **)&PTR__rt_binary_expr_00127c18;
  prVar6[1]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var,iVar2);
  prVar6[2]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_00,iVar3);
  prVar6[3]._vptr_rt_expression_interface = (_func_int **)CONCAT44(extraout_var_01,iVar4);
  return prVar6;
}

Assistant:

InterfaceType * recursive_manipulation(rt_manipulation_wrapper<InterfaceType> const & fw) const
      {
        if (fw.modifies(this))
          return fw(this);

        return new rt_binary_expr(lhs_->recursive_manipulation(fw),
                               op_->clone(),
                               rhs_->recursive_manipulation(fw) );
      }